

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_text.cpp
# Opt level: O0

int main(void)

{
  char text [100];
  char acStackY_68 [8];
  char *in_stack_ffffffffffffffa0;
  
  strcpy(acStackY_68,"hey Lou, how are you?");
  printf("Original: %s \n",acStackY_68);
  obme::OBME_T(in_stack_ffffffffffffffa0);
  printf("Obfuscated: %s \n",acStackY_68);
  obme::OBME_T(in_stack_ffffffffffffffa0);
  printf("Restored: %s \n",acStackY_68);
  return 1;
}

Assistant:

int main()
{
	char text[100];
	strcpy(text, "hey Lou, how are you?");
	printf("Original: %s \n", text);
	OBME_T(text);
    
	printf("Obfuscated: %s \n", text);
	OBME_T(text);
	printf("Restored: %s \n", text);
	
	return 1;
}